

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O3

VP8StatusCode
ParseOptionalChunks(uint8_t **data,size_t *data_size,size_t riff_size,uint8_t **alpha_data,
                   size_t *alpha_size)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  piVar4 = (int *)*data;
  uVar5 = *data_size;
  *alpha_data = (uint8_t *)0x0;
  *alpha_size = 0;
  *data = (uint8_t *)piVar4;
  *data_size = uVar5;
  if (uVar5 < 8) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  uVar6 = 0x16;
  while( true ) {
    uVar1 = piVar4[1];
    if (0xfffffff6 < uVar1) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    uVar3 = uVar1 + 9 & 0xfffffffe;
    uVar6 = (ulong)((int)uVar6 + uVar3);
    if ((riff_size != 0) && (riff_size < uVar6)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (*piVar4 == 0x20385056) {
      return VP8_STATUS_OK;
    }
    if (*piVar4 == 0x4c385056) break;
    uVar2 = (ulong)uVar3;
    bVar7 = uVar5 < uVar2;
    uVar5 = uVar5 - uVar2;
    if (bVar7) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    if (*piVar4 == 0x48504c41) {
      *alpha_data = (uint8_t *)(piVar4 + 2);
      *alpha_size = (ulong)uVar1;
    }
    piVar4 = (int *)((long)piVar4 + uVar2);
    *data = (uint8_t *)piVar4;
    *data_size = uVar5;
    if (uVar5 < 8) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
  }
  return VP8_STATUS_OK;
}

Assistant:

static VP8StatusCode ParseOptionalChunks(const uint8_t** const data,
                                         size_t* const data_size,
                                         size_t const riff_size,
                                         const uint8_t** const alpha_data,
                                         size_t* const alpha_size) {
  const uint8_t* buf;
  size_t buf_size;
  uint32_t total_size = TAG_SIZE +           // "WEBP".
                        CHUNK_HEADER_SIZE +  // "VP8Xnnnn".
                        VP8X_CHUNK_SIZE;     // data.
  assert(data != NULL);
  assert(data_size != NULL);
  buf = *data;
  buf_size = *data_size;

  assert(alpha_data != NULL);
  assert(alpha_size != NULL);
  *alpha_data = NULL;
  *alpha_size = 0;

  while (1) {
    uint32_t chunk_size;
    uint32_t disk_chunk_size;   // chunk_size with padding

    *data = buf;
    *data_size = buf_size;

    if (buf_size < CHUNK_HEADER_SIZE) {  // Insufficient data.
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }

    chunk_size = GetLE32(buf + TAG_SIZE);
    if (chunk_size > MAX_CHUNK_PAYLOAD) {
      return VP8_STATUS_BITSTREAM_ERROR;          // Not a valid chunk size.
    }
    // For odd-sized chunk-payload, there's one byte padding at the end.
    disk_chunk_size = (CHUNK_HEADER_SIZE + chunk_size + 1) & ~1u;
    total_size += disk_chunk_size;

    // Check that total bytes skipped so far does not exceed riff_size.
    if (riff_size > 0 && (total_size > riff_size)) {
      return VP8_STATUS_BITSTREAM_ERROR;          // Not a valid chunk size.
    }

    // Start of a (possibly incomplete) VP8/VP8L chunk implies that we have
    // parsed all the optional chunks.
    // Note: This check must occur before the check 'buf_size < disk_chunk_size'
    // below to allow incomplete VP8/VP8L chunks.
    if (!memcmp(buf, "VP8 ", TAG_SIZE) ||
        !memcmp(buf, "VP8L", TAG_SIZE)) {
      return VP8_STATUS_OK;
    }

    if (buf_size < disk_chunk_size) {             // Insufficient data.
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }

    if (!memcmp(buf, "ALPH", TAG_SIZE)) {         // A valid ALPH header.
      *alpha_data = buf + CHUNK_HEADER_SIZE;
      *alpha_size = chunk_size;
    }

    // We have a full and valid chunk; skip it.
    buf += disk_chunk_size;
    buf_size -= disk_chunk_size;
  }
}